

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_event_listener.cpp
# Opt level: O0

void HawkTracer::parser::print_event(Event *event,size_t indent)

{
  bool bVar1;
  FieldTypeId FVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
  *this;
  ostream *poVar3;
  undefined1 local_b0 [87];
  allocator local_59;
  string local_58 [32];
  reference local_38;
  value_type *value;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
  *__range2;
  size_t indent_local;
  Event *event_local;
  
  this = Event::get_values_abi_cxx11_(event);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
           ::begin(this);
  value = (value_type *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
          ::end(this);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_true>
                         *)&value);
    if (!bVar1) break;
    local_38 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_false,_true>
               ::operator*(&__end2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,indent,' ',&local_59);
    std::operator<<((ostream *)&std::cout,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    EventKlassField::get_type_name_abi_cxx11_((EventKlassField *)(local_b0 + 0x20));
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(local_b0 + 0x20));
    poVar3 = std::operator<<(poVar3,' ');
    EventKlassField::get_name_abi_cxx11_((EventKlassField *)local_b0);
    poVar3 = std::operator<<(poVar3,(string *)local_b0);
    std::operator<<(poVar3,": ");
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)(local_b0 + 0x20));
    FVar2 = EventKlassField::get_type_id((local_38->second).field);
    if (FVar2 == STRUCT) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      print_event((local_38->second).value.f_EVENT,indent + 2);
    }
    else {
      print_field_value(&local_38->second);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_false,_true>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void print_event(const Event& event, size_t indent)
{
    for (const auto& value : event.get_values())
    {
        std::cout << std::string(indent, ' ');
        std::cout << value.second.field->get_type_name() << ' ' << value.second.field->get_name() << ": ";
        
        if (value.second.field->get_type_id() == FieldTypeId::STRUCT)
        {
            std::cout << std::endl;
            print_event(*value.second.value.f_EVENT, indent + 2);
        }
        else
        {
            print_field_value(value.second);
        }
    }
}